

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCase *testCase)

{
  __type _Var1;
  logic_error *this_00;
  string name;
  
  std::__cxx11::string::string((string *)&name,(string *)testCase);
  toLowerInPlace(&name);
  switch(this->m_wildcardPosition) {
  case NoWildcard:
    _Var1 = std::operator==(&this->m_stringToMatch,&name);
    break;
  case WildcardAtStart:
    _Var1 = endsWith(&name,&this->m_stringToMatch);
    break;
  case WildcardAtEnd:
    _Var1 = startsWith(&name,&this->m_stringToMatch);
    break;
  case WildcardAtBothEnds:
    _Var1 = contains(&name,&this->m_stringToMatch);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::~string((string *)&name);
  return _Var1;
}

Assistant:

bool isMatch( TestCase const& testCase ) const {
            std::string name = testCase.getTestCaseInfo().name;
            toLowerInPlace( name );

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }